

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Lexer.cpp
# Opt level: O3

void __thiscall
psy::C::Lexer::DiagnosticsReporter::IncompatibleLanguageExtension
          (DiagnosticsReporter *this,string *feature,Ext expectedExt)

{
  long *plVar1;
  pointer pcVar2;
  SyntaxTree *this_00;
  undefined8 *puVar3;
  IndexType tkIdx;
  Ext ext;
  ulong uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  DiagnosticDescriptor descriptor;
  ulong *local_1a0;
  long local_198;
  ulong local_190 [2];
  long *local_180;
  undefined8 local_178;
  long local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  string local_160;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  undefined1 local_100 [32];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  DiagnosticSeverity local_a0;
  DiagnosticCategory DStack_9f;
  DiagnosticDescriptor local_98;
  
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,ID_of_IncompatibleLanguageExtension_abi_cxx11_._M_dataplus._M_p,
             ID_of_IncompatibleLanguageExtension_abi_cxx11_._M_dataplus._M_p +
             ID_of_IncompatibleLanguageExtension_abi_cxx11_._M_string_length);
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"Incompatible language extension","");
  pcVar2 = (feature->_M_dataplus)._M_p;
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar2,pcVar2 + feature->_M_string_length);
  std::__cxx11::string::append((char *)&local_1a0);
  to_string_abi_cxx11_(&local_160,(C *)(ulong)expectedExt,ext);
  uVar4 = 0xf;
  if (local_1a0 != local_190) {
    uVar4 = local_190[0];
  }
  if (uVar4 < local_160._M_string_length + local_198) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      uVar5 = local_160.field_2._M_allocated_capacity;
    }
    if (local_160._M_string_length + local_198 <= (ulong)uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_1a0);
      goto LAB_002a5d5c;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_160._M_dataplus._M_p);
LAB_002a5d5c:
  local_180 = &local_170;
  plVar1 = puVar3 + 2;
  if ((long *)*puVar3 == plVar1) {
    local_170 = *plVar1;
    uStack_168 = *(undefined4 *)(puVar3 + 3);
    uStack_164 = *(undefined4 *)((long)puVar3 + 0x1c);
  }
  else {
    local_170 = *plVar1;
    local_180 = (long *)*puVar3;
  }
  local_178 = puVar3[1];
  *puVar3 = plVar1;
  puVar3[1] = 0;
  *(undefined1 *)plVar1 = 0;
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_98,local_120,local_140,&local_180,1,1);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,local_190[0] + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  this_00 = this->lexer_->tree_;
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_100,local_98.id_._M_dataplus._M_p,
             local_98.id_._M_dataplus._M_p + local_98.id_._M_string_length);
  local_e0._M_p = (pointer)&local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_98.title_._M_dataplus._M_p,
             local_98.title_._M_dataplus._M_p + local_98.title_._M_string_length);
  local_c0._M_p = (pointer)&local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,local_98.description_._M_dataplus._M_p,
             local_98.description_._M_dataplus._M_p + local_98.description_._M_string_length);
  local_a0 = local_98.defaultSeverity_;
  DStack_9f = local_98.category_;
  tkIdx = SyntaxTree::freeTokenSlot(this->lexer_->tree_);
  SyntaxTree::newDiagnostic(this_00,(DiagnosticDescriptor *)local_100,tkIdx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p != &local_d0) {
    operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.description_._M_dataplus._M_p != &local_98.description_.field_2) {
    operator_delete(local_98.description_._M_dataplus._M_p,
                    local_98.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.title_._M_dataplus._M_p != &local_98.title_.field_2) {
    operator_delete(local_98.title_._M_dataplus._M_p,
                    local_98.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.id_._M_dataplus._M_p != &local_98.id_.field_2) {
    operator_delete(local_98.id_._M_dataplus._M_p,local_98.id_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Lexer::DiagnosticsReporter::IncompatibleLanguageExtension(
        const std::string& feature,
        LanguageExtensions::Ext expectedExt)
{
    DiagnosticDescriptor descriptor(ID_of_IncompatibleLanguageExtension,
                                    "Incompatible language extension",
                                    feature + " is available in " + to_string(expectedExt),
                                    DiagnosticSeverity::Warning,
                                    DiagnosticCategory::Syntax);

    lexer_->tree_->newDiagnostic(descriptor, lexer_->tree_->freeTokenSlot());
}